

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void TestAnnotation(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  bool bVar11;
  int iVar12;
  Template *pTVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  char *pcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e00 [39];
  allocator local_2dd9;
  string local_2dd8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2db8 [32];
  TemplateString local_2d98;
  TemplateString local_2d78;
  TemplateString local_2d58;
  TemplateDictionary local_2d38 [8];
  TemplateDictionary dict_missing_file;
  allocator local_2cc1;
  string local_2cc0 [32];
  Template *local_2ca0;
  Template *one_inc_tpl;
  string local_2c90 [39];
  allocator local_2c69;
  string local_2c68 [39];
  allocator local_2c41;
  string local_2c40 [32];
  string local_2c20 [8];
  string custom_outstring;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c00 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2be0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2bc0 [32];
  undefined1 local_2ba0 [8];
  CustomTestAnnotator custom_annotator;
  string local_2b88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b28 [32];
  char local_2b08 [8];
  char expected [10240];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  string local_2b0 [8];
  string slash_tpl;
  TemplateString local_290;
  TemplateString local_270;
  TemplateString local_250;
  TemplateString local_230;
  TemplateString local_210;
  TemplateString local_1f0;
  TemplateString local_1d0;
  undefined8 local_1b0;
  TemplateDictionary *incdict;
  size_t sStack_1a0;
  bool local_198;
  undefined7 uStack_197;
  TemplateId TStack_190;
  undefined1 local_188 [8];
  PerExpandData per_expand_data;
  TemplateDictionary local_148 [8];
  TemplateDictionary dict;
  allocator local_d1;
  string local_d0 [32];
  Template *local_b0;
  Template *tpl;
  string local_a0 [32];
  ctemplate local_80 [8];
  string incname2;
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string incname;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"include {{#ISEC}}file{{/ISEC}}\n",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"include #2\n",(allocator *)((long)&tpl + 7));
  ctemplate::StringToTemplateFile(local_80,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,
             "boo!\n{{>INC}}\nhi {{#SEC}}lo{{#SUBSEC}}jo{{/SUBSEC}}{{/SEC}} bar {{VAR:x-foo}}",
             &local_d1);
  pTVar13 = ctemplate::StringToTemplate((string *)local_d0,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_b0 = pTVar13;
  ctemplate::TemplateString::TemplateString((TemplateString *)&per_expand_data.map_,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_148,(TemplateString *)&per_expand_data.map_,(UnsafeArena *)0x0);
  ctemplate::PerExpandData::PerExpandData((PerExpandData *)local_188);
  ctemplate::TemplateString::TemplateString((TemplateString *)&incdict,"SEC");
  TVar1.length_ = sStack_1a0;
  TVar1.ptr_ = (char *)incdict;
  TVar1.is_immutable_ = local_198;
  TVar1._17_7_ = uStack_197;
  TVar1.id_ = TStack_190;
  ctemplate::TemplateDictionary::ShowSection(TVar1);
  ctemplate::TemplateString::TemplateString(&local_1d0,"INC");
  TVar2.length_ = local_1d0.length_;
  TVar2.ptr_ = local_1d0.ptr_;
  TVar2.is_immutable_ = local_1d0.is_immutable_;
  TVar2._17_7_ = local_1d0._17_7_;
  TVar2.id_ = local_1d0.id_;
  local_1b0 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar2);
  ctemplate::TemplateString::TemplateString(&local_1f0,(string *)local_28);
  TVar3.length_ = local_1f0.length_;
  TVar3.ptr_ = local_1f0.ptr_;
  TVar3.is_immutable_ = local_1f0.is_immutable_;
  TVar3._17_7_ = local_1f0._17_7_;
  TVar3.id_ = local_1f0.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar3);
  ctemplate::TemplateString::TemplateString(&local_210,"ISEC");
  TVar4.length_ = local_210.length_;
  TVar4.ptr_ = local_210.ptr_;
  TVar4.is_immutable_ = local_210.is_immutable_;
  TVar4._17_7_ = local_210._17_7_;
  TVar4.id_ = local_210.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar4);
  ctemplate::TemplateString::TemplateString(&local_230,"INC");
  TVar5.length_ = local_230.length_;
  TVar5.ptr_ = local_230.ptr_;
  TVar5.is_immutable_ = local_230.is_immutable_;
  TVar5._17_7_ = local_230._17_7_;
  TVar5.id_ = local_230.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar5);
  ctemplate::TemplateString::TemplateString(&local_250,(string *)local_80);
  TVar6.length_ = local_250.length_;
  TVar6.ptr_ = local_250.ptr_;
  TVar6.is_immutable_ = local_250.is_immutable_;
  TVar6._17_7_ = local_250._17_7_;
  TVar6.id_ = local_250.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar6);
  ctemplate::TemplateString::TemplateString(&local_270,"VAR");
  ctemplate::TemplateString::TemplateString(&local_290,"var");
  TVar7.length_ = local_270.length_;
  TVar7.ptr_ = local_270.ptr_;
  TVar7.is_immutable_ = local_270.is_immutable_;
  TVar7._17_7_ = local_270._17_7_;
  TVar7.id_ = local_270.id_;
  TVar10.length_ = local_290.length_;
  TVar10.ptr_ = local_290.ptr_;
  TVar10.is_immutable_ = local_290.is_immutable_;
  TVar10._17_7_ = local_290._17_7_;
  TVar10.id_ = local_290.id_;
  ctemplate::TemplateDictionary::SetValue(TVar7,TVar10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,(char *)&ctemplate::kRootdir,&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"template.",&local_2f9);
  ctemplate::PathJoin(local_2b0,local_2d0);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  ctemplate::PerExpandData::SetAnnotateOutput((PerExpandData *)local_188,"");
  std::operator+(local_2b28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  uVar14 = std::__cxx11::string::c_str();
  std::operator+(local_2b48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  uVar15 = std::__cxx11::string::c_str();
  std::operator+(local_2b68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  uVar16 = std::__cxx11::string::c_str();
  snprintf(local_2b08,0x2800,
           "{{#FILE=%s003}}{{#SEC=__{{MAIN}}__}}boo!\n{{#INC=INC}}{{#FILE=%s001}}{{#SEC=__{{MAIN}}__}}include {{#SEC=ISEC}}file{{/SEC}}\n{{/SEC}}{{/FILE}}{{/INC}}{{#INC=INC}}{{#FILE=%s002}}{{#SEC=__{{MAIN}}__}}include #2\n{{/SEC}}{{/FILE}}{{/INC}}\nhi {{#SEC=SEC}}lo{{/SEC}} bar {{#VAR=VAR:x-foo<not registered>}}var{{/VAR}}{{/SEC}}{{/FILE}}"
           ,uVar14,uVar15,uVar16);
  std::__cxx11::string::~string((string *)local_2b68);
  std::__cxx11::string::~string((string *)local_2b48);
  std::__cxx11::string::~string((string *)local_2b28);
  pTVar13 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b88,local_2b08,(allocator *)&custom_annotator.field_0xf);
  ctemplate::AssertExpandWithDataIs
            (pTVar13,local_148,(PerExpandData *)local_188,(string *)local_2b88,true);
  std::__cxx11::string::~string(local_2b88);
  std::allocator<char>::~allocator((allocator<char> *)&custom_annotator.field_0xf);
  CustomTestAnnotator::CustomTestAnnotator((CustomTestAnnotator *)local_2ba0);
  ctemplate::PerExpandData::SetAnnotator((PerExpandData *)local_188,(TemplateAnnotator *)local_2ba0)
  ;
  std::operator+(local_2bc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  uVar14 = std::__cxx11::string::c_str();
  std::operator+(local_2be0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  uVar15 = std::__cxx11::string::c_str();
  std::operator+(local_2c00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  uVar16 = std::__cxx11::string::c_str();
  snprintf(local_2b08,0x2800,
           "{{EVENT=1}}{{#FILE=%s003}}{{EVENT=2}}{{#SEC=__{{MAIN}}__}}boo!\n{{EVENT=3}}{{#INC=INC}}{{EVENT=4}}{{#FILE=%s001}}{{EVENT=5}}{{#SEC=__{{MAIN}}__}}include {{EVENT=6}}{{#SEC=ISEC}}file{{EVENT=7}}{{/SEC}}\n{{EVENT=8}}{{/SEC}}{{EVENT=9}}{{/FILE}}{{EVENT=10}}{{/INC}}{{EVENT=11}}{{#INC=INC}}{{EVENT=12}}{{#FILE=%s002}}{{EVENT=13}}{{#SEC=__{{MAIN}}__}}include #2\n{{EVENT=14}}{{/SEC}}{{EVENT=15}}{{/FILE}}{{EVENT=16}}{{/INC}}\nhi {{EVENT=17}}{{#SEC=SEC}}lo{{EVENT=18}}{{/SEC}} bar {{EVENT=19}}{{#VAR=VAR:x-foo<not registered>}}var{{EVENT=20}}{{/VAR}}{{EVENT=21}}{{/SEC}}{{EVENT=22}}{{/FILE}}"
           ,uVar14,uVar15,uVar16);
  std::__cxx11::string::~string((string *)local_2c00);
  std::__cxx11::string::~string((string *)local_2be0);
  std::__cxx11::string::~string((string *)local_2bc0);
  std::__cxx11::string::string(local_2c20);
  bVar11 = ctemplate::Template::ExpandWithData
                     (local_b0,(string *)local_2c20,(TemplateDictionaryInterface *)local_148,
                      (PerExpandData *)local_188);
  if (!bVar11) {
    printf("ASSERT FAILED, line %d: %s\n",0x1bf,
           "tpl->ExpandWithData(&custom_outstring, &dict, &per_expand_data)");
    bVar11 = ctemplate::Template::ExpandWithData
                       (local_b0,(string *)local_2c20,(TemplateDictionaryInterface *)local_148,
                        (PerExpandData *)local_188);
    if (!bVar11) {
      __assert_fail("tpl->ExpandWithData(&custom_outstring, &dict, &per_expand_data)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x1bf,"void TestAnnotation()");
    }
    exit(1);
  }
  pcVar17 = (char *)std::__cxx11::string::c_str();
  iVar12 = strcmp(pcVar17,local_2b08);
  if (iVar12 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x1c0,"strcmp(custom_outstring.c_str(), expected) == 0");
    pcVar17 = (char *)std::__cxx11::string::c_str();
    iVar12 = strcmp(pcVar17,local_2b08);
    if (iVar12 == 0) {
      exit(1);
    }
    __assert_fail("strcmp(custom_outstring.c_str(), expected) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x1c0,"void TestAnnotation()");
  }
  ctemplate::PerExpandData::SetAnnotator((PerExpandData *)local_188,(TemplateAnnotator *)0x0);
  pcVar17 = (char *)std::__cxx11::string::c_str();
  ctemplate::PerExpandData::SetAnnotateOutput((PerExpandData *)local_188,pcVar17);
  uVar14 = std::__cxx11::string::c_str();
  uVar15 = std::__cxx11::string::c_str();
  uVar16 = std::__cxx11::string::c_str();
  snprintf(local_2b08,0x2800,
           "{{#FILE=%s003}}{{#SEC=__{{MAIN}}__}}boo!\n{{#INC=INC}}{{#FILE=%s001}}{{#SEC=__{{MAIN}}__}}include {{#SEC=ISEC}}file{{/SEC}}\n{{/SEC}}{{/FILE}}{{/INC}}{{#INC=INC}}{{#FILE=%s002}}{{#SEC=__{{MAIN}}__}}include #2\n{{/SEC}}{{/FILE}}{{/INC}}\nhi {{#SEC=SEC}}lo{{/SEC}} bar {{#VAR=VAR:x-foo<not registered>}}var{{/VAR}}{{/SEC}}{{/FILE}}"
           ,uVar14,uVar15,uVar16);
  pTVar13 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c40,local_2b08,&local_2c41);
  ctemplate::AssertExpandWithDataIs
            (pTVar13,local_148,(PerExpandData *)local_188,(string *)local_2c40,true);
  std::__cxx11::string::~string(local_2c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c41);
  ctemplate::PerExpandData::SetAnnotateOutput((PerExpandData *)local_188,(char *)0x0);
  pTVar13 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2c68,"boo!\ninclude file\ninclude #2\n\nhi lo bar var",&local_2c69);
  ctemplate::AssertExpandWithDataIs
            (pTVar13,local_148,(PerExpandData *)local_188,(string *)local_2c68,true);
  std::__cxx11::string::~string(local_2c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c69);
  ctemplate::PerExpandData::SetAnnotator((PerExpandData *)local_188,(TemplateAnnotator *)local_2ba0)
  ;
  pTVar13 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2c90,"boo!\ninclude file\ninclude #2\n\nhi lo bar var",
             (allocator *)((long)&one_inc_tpl + 7));
  ctemplate::AssertExpandWithDataIs
            (pTVar13,local_148,(PerExpandData *)local_188,(string *)local_2c90,true);
  std::__cxx11::string::~string(local_2c90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&one_inc_tpl + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2cc0,"File contents: {{>INC}}\n",&local_2cc1);
  pTVar13 = ctemplate::StringToTemplate((string *)local_2cc0,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_2cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2cc1);
  local_2ca0 = pTVar13;
  ctemplate::TemplateString::TemplateString(&local_2d58,"dict_with_missing_file");
  ctemplate::TemplateDictionary::TemplateDictionary(local_2d38,&local_2d58,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_2d78,"INC");
  TVar8.length_ = local_2d78.length_;
  TVar8.ptr_ = local_2d78.ptr_;
  TVar8.is_immutable_ = local_2d78.is_immutable_;
  TVar8._17_7_ = local_2d78._17_7_;
  TVar8.id_ = local_2d78.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar8);
  ctemplate::TemplateString::TemplateString(&local_2d98,"missing.tpl");
  TVar9.length_ = local_2d98.length_;
  TVar9.ptr_ = local_2d98.ptr_;
  TVar9.is_immutable_ = local_2d98.is_immutable_;
  TVar9._17_7_ = local_2d98._17_7_;
  TVar9.id_ = local_2d98.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar9);
  ctemplate::PerExpandData::SetAnnotateOutput((PerExpandData *)local_188,"");
  ctemplate::PerExpandData::SetAnnotator((PerExpandData *)local_188,(TemplateAnnotator *)0x0);
  std::operator+(local_2db8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  uVar14 = std::__cxx11::string::c_str();
  snprintf(local_2b08,0x2800,
           "{{#FILE=%s004}}{{#SEC=__{{MAIN}}__}}File contents: {{#INC=INC}}{{MISSING_FILE=missing.tpl}}{{/INC}}\n{{/SEC}}{{/FILE}}"
           ,uVar14);
  std::__cxx11::string::~string((string *)local_2db8);
  pTVar13 = local_2ca0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2dd8,local_2b08,&local_2dd9);
  ctemplate::AssertExpandWithDataIs
            (pTVar13,local_2d38,(PerExpandData *)local_188,(string *)local_2dd8,false);
  std::__cxx11::string::~string(local_2dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2dd9);
  CustomTestAnnotator::Reset((CustomTestAnnotator *)local_2ba0);
  ctemplate::PerExpandData::SetAnnotator((PerExpandData *)local_188,(TemplateAnnotator *)local_2ba0)
  ;
  std::operator+(local_2e00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  uVar14 = std::__cxx11::string::c_str();
  snprintf(local_2b08,0x2800,
           "{{EVENT=1}}{{#FILE=%s004}}{{EVENT=2}}{{#SEC=__{{MAIN}}__}}File contents: {{EVENT=3}}{{#INC=INC}}{{EVENT=4}}{{MISSING_FILE=missing.tpl}}{{EVENT=5}}{{/INC}}\n{{EVENT=6}}{{/SEC}}{{EVENT=7}}{{/FILE}}"
           ,uVar14);
  std::__cxx11::string::~string((string *)local_2e00);
  std::__cxx11::string::clear();
  bVar11 = ctemplate::Template::ExpandWithData
                     (local_2ca0,(string *)local_2c20,(TemplateDictionaryInterface *)local_2d38,
                      (PerExpandData *)local_188);
  if (bVar11) {
    printf("ASSERT FAILED, line %d: %s\n",0x203,
           "!one_inc_tpl->ExpandWithData(&custom_outstring, &dict_missing_file, &per_expand_data)");
    bVar11 = ctemplate::Template::ExpandWithData
                       (local_2ca0,(string *)local_2c20,(TemplateDictionaryInterface *)local_2d38,
                        (PerExpandData *)local_188);
    if (((bVar11 ^ 0xffU) & 1) == 0) {
      __assert_fail("!one_inc_tpl->ExpandWithData(&custom_outstring, &dict_missing_file, &per_expand_data)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x203,"void TestAnnotation()");
    }
    exit(1);
  }
  pcVar17 = (char *)std::__cxx11::string::c_str();
  iVar12 = strcmp(pcVar17,local_2b08);
  if (iVar12 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x204,"strcmp(custom_outstring.c_str(), expected) == 0");
    pcVar17 = (char *)std::__cxx11::string::c_str();
    iVar12 = strcmp(pcVar17,local_2b08);
    if (iVar12 == 0) {
      exit(1);
    }
    __assert_fail("strcmp(custom_outstring.c_str(), expected) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x204,"void TestAnnotation()");
  }
  ctemplate::TemplateDictionary::~TemplateDictionary(local_2d38);
  std::__cxx11::string::~string(local_2c20);
  CustomTestAnnotator::~CustomTestAnnotator((CustomTestAnnotator *)local_2ba0);
  std::__cxx11::string::~string(local_2b0);
  ctemplate::PerExpandData::~PerExpandData((PerExpandData *)local_188);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_148);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

static void TestAnnotation() {
  string incname = StringToTemplateFile("include {{#ISEC}}file{{/ISEC}}\n");
  string incname2 = StringToTemplateFile("include #2\n");
  Template* tpl = StringToTemplate(
      "boo!\n{{>INC}}\nhi {{#SEC}}lo{{#SUBSEC}}jo{{/SUBSEC}}{{/SEC}} bar "
      "{{VAR:x-foo}}",
      DO_NOT_STRIP);
  TemplateDictionary dict("dict");
  PerExpandData per_expand_data;

  dict.ShowSection("SEC");
  TemplateDictionary* incdict = dict.AddIncludeDictionary("INC");
  incdict->SetFilename(incname);
  incdict->ShowSection("ISEC");
  dict.AddIncludeDictionary("INC")->SetFilename(incname2);
  dict.SetValue("VAR", "var");

  // This string is equivalent to "/template." (at least on unix)
  string slash_tpl(PathJoin(kRootdir, "template."));
  per_expand_data.SetAnnotateOutput("");
  char expected[10240];           // 10k should be big enough!
  snprintf(expected, sizeof(expected),
           "{{#FILE=%s003}}{{#SEC=__{{MAIN}}__}}boo!\n"
           "{{#INC=INC}}{{#FILE=%s001}}"
           "{{#SEC=__{{MAIN}}__}}include {{#SEC=ISEC}}file{{/SEC}}\n"
           "{{/SEC}}{{/FILE}}{{/INC}}"
           "{{#INC=INC}}{{#FILE=%s002}}"
           "{{#SEC=__{{MAIN}}__}}include #2\n{{/SEC}}{{/FILE}}{{/INC}}"
           "\nhi {{#SEC=SEC}}lo{{/SEC}} bar "
           "{{#VAR=VAR:x-foo<not registered>}}var{{/VAR}}{{/SEC}}{{/FILE}}",
           (FLAGS_test_tmpdir + slash_tpl).c_str(),
           (FLAGS_test_tmpdir + slash_tpl).c_str(),
           (FLAGS_test_tmpdir + slash_tpl).c_str());
  AssertExpandWithDataIs(tpl, &dict, &per_expand_data, expected, true);

  // Test ability to set custom annotator.
  CustomTestAnnotator custom_annotator;
  per_expand_data.SetAnnotator(&custom_annotator);
  snprintf(expected, sizeof(expected),
           "{{EVENT=1}}{{#FILE=%s003}}"
           "{{EVENT=2}}{{#SEC=__{{MAIN}}__}}boo!\n"
           "{{EVENT=3}}{{#INC=INC}}"
           "{{EVENT=4}}{{#FILE=%s001}}"
           "{{EVENT=5}}{{#SEC=__{{MAIN}}__}}include "
           "{{EVENT=6}}{{#SEC=ISEC}}file"
           "{{EVENT=7}}{{/SEC}}\n"
           "{{EVENT=8}}{{/SEC}}"
           "{{EVENT=9}}{{/FILE}}"
           "{{EVENT=10}}{{/INC}}"
           "{{EVENT=11}}{{#INC=INC}}"
           "{{EVENT=12}}{{#FILE=%s002}}"
           "{{EVENT=13}}{{#SEC=__{{MAIN}}__}}include #2\n"
           "{{EVENT=14}}{{/SEC}}"
           "{{EVENT=15}}{{/FILE}}"
           "{{EVENT=16}}{{/INC}}\nhi "
           "{{EVENT=17}}{{#SEC=SEC}}lo"
           "{{EVENT=18}}{{/SEC}} bar "
           "{{EVENT=19}}{{#VAR=VAR:x-foo<not registered>}}var"
           "{{EVENT=20}}{{/VAR}}"
           "{{EVENT=21}}{{/SEC}}"
           "{{EVENT=22}}{{/FILE}}",
           (FLAGS_test_tmpdir + slash_tpl).c_str(),
           (FLAGS_test_tmpdir + slash_tpl).c_str(),
           (FLAGS_test_tmpdir + slash_tpl).c_str());
  // We can't use AssertExpandWithDataIs() on our deliberately stateful
  // test annotator because it internally does a second expansion
  // assuming no state change between calls.
  string custom_outstring;
  ASSERT(tpl->ExpandWithData(&custom_outstring, &dict, &per_expand_data));
  ASSERT_STREQ(custom_outstring.c_str(), expected);

  // Unset annotator and continue with next test as test of ability
  // to revert to built-in annotator.
  per_expand_data.SetAnnotator(NULL);

  per_expand_data.SetAnnotateOutput(slash_tpl.c_str());
  snprintf(expected, sizeof(expected),
           "{{#FILE=%s003}}{{#SEC=__{{MAIN}}__}}boo!\n"
           "{{#INC=INC}}{{#FILE=%s001}}"
           "{{#SEC=__{{MAIN}}__}}include {{#SEC=ISEC}}file{{/SEC}}\n"
           "{{/SEC}}{{/FILE}}{{/INC}}"
           "{{#INC=INC}}{{#FILE=%s002}}"
           "{{#SEC=__{{MAIN}}__}}include #2\n{{/SEC}}{{/FILE}}{{/INC}}"
           "\nhi {{#SEC=SEC}}lo{{/SEC}} bar "
           "{{#VAR=VAR:x-foo<not registered>}}var{{/VAR}}{{/SEC}}{{/FILE}}",
           (slash_tpl).c_str(),
           (slash_tpl).c_str(),
           (slash_tpl).c_str());
  AssertExpandWithDataIs(tpl, &dict, &per_expand_data, expected, true);

  per_expand_data.SetAnnotateOutput(NULL);   // should turn off annotations
  AssertExpandWithDataIs(tpl, &dict, &per_expand_data,
                         "boo!\ninclude file\ninclude #2\n\nhi lo bar var",
                         true);

  // Test that even if we set an annotator we shouldn't get annotation
  // if it is not turned on with SetAnnotateOutput().
  per_expand_data.SetAnnotator(&custom_annotator);
  AssertExpandWithDataIs(tpl, &dict, &per_expand_data,
                         "boo!\ninclude file\ninclude #2\n\nhi lo bar var",
                         true);

  // Test annotation of "missing include" condition.
  Template* one_inc_tpl =
      StringToTemplate("File contents: {{>INC}}\n", DO_NOT_STRIP);
  TemplateDictionary dict_missing_file("dict_with_missing_file");
  dict_missing_file.AddIncludeDictionary("INC")->SetFilename("missing.tpl");

  per_expand_data.SetAnnotateOutput("");
  per_expand_data.SetAnnotator(NULL);
  snprintf(expected, sizeof(expected),
           "{{#FILE=%s004}}{{#SEC=__{{MAIN}}__}}File contents: "
           "{{#INC=INC}}{{MISSING_FILE=missing.tpl}}{{/INC}}\n"
           "{{/SEC}}{{/FILE}}",
           (FLAGS_test_tmpdir + slash_tpl).c_str());
  // We expect a false return value because of the missing file.
  AssertExpandWithDataIs(one_inc_tpl, &dict_missing_file, &per_expand_data,
                         expected, false);

  // Same missing include test with custom annotator
  custom_annotator.Reset();
  per_expand_data.SetAnnotator(&custom_annotator);
  snprintf(expected, sizeof(expected),
           "{{EVENT=1}}{{#FILE=%s004}}"
           "{{EVENT=2}}{{#SEC=__{{MAIN}}__}}File contents: "
           "{{EVENT=3}}{{#INC=INC}}"
           "{{EVENT=4}}{{MISSING_FILE=missing.tpl}}"
           "{{EVENT=5}}{{/INC}}\n"
           "{{EVENT=6}}{{/SEC}}"
           "{{EVENT=7}}{{/FILE}}",
           (FLAGS_test_tmpdir + slash_tpl).c_str());
  // See comment above on why we can't use AssertExpandWithDataIs() for
  // our stateful test annotator.
  custom_outstring.clear();
  ASSERT(!one_inc_tpl->ExpandWithData(&custom_outstring,
                                      &dict_missing_file,
                                      &per_expand_data));
  ASSERT_STREQ(custom_outstring.c_str(), expected);
}